

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O0

void __thiscall
soul::heart::Printer::PrinterStream::printStatementDescription(PrinterStream *this,Object *s)

{
  bool bVar1;
  AssignFromValue *a;
  FunctionCall *f;
  ReadStream *r;
  WriteStream *w;
  AdvanceClock *pAVar2;
  Branch *b;
  BranchIf *b_00;
  ReturnVoid *pRVar3;
  ReturnValue *r_00;
  pool_ptr<const_soul::heart::ReturnValue> local_70;
  pool_ptr<const_soul::heart::ReturnValue> t_8;
  pool_ptr<const_soul::heart::ReturnVoid> t_7;
  pool_ptr<const_soul::heart::BranchIf> t_6;
  pool_ptr<const_soul::heart::Branch> t_5;
  pool_ptr<const_soul::heart::AdvanceClock> t_4;
  pool_ptr<const_soul::heart::WriteStream> t_3;
  pool_ptr<const_soul::heart::ReadStream> t_2;
  pool_ptr<const_soul::heart::FunctionCall> t_1;
  pool_ptr<const_soul::heart::AssignFromValue> local_20;
  pool_ptr<const_soul::heart::AssignFromValue> t;
  Object *s_local;
  PrinterStream *this_local;
  
  t.object = (AssignFromValue *)s;
  cast<soul::heart::AssignFromValue_const,soul::heart::Object_const>((soul *)&local_20,s);
  bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_20);
  if (bVar1) {
    a = pool_ptr<const_soul::heart::AssignFromValue>::operator*(&local_20);
    printDescription(this,a);
  }
  pool_ptr<const_soul::heart::AssignFromValue>::~pool_ptr(&local_20);
  if (!bVar1) {
    cast<soul::heart::FunctionCall_const,soul::heart::Object_const>((soul *)&t_2,(Object *)t.object)
    ;
    bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&t_2);
    if (bVar1) {
      f = pool_ptr<const_soul::heart::FunctionCall>::operator*
                    ((pool_ptr<const_soul::heart::FunctionCall> *)&t_2);
      printDescription(this,f);
    }
    pool_ptr<const_soul::heart::FunctionCall>::~pool_ptr
              ((pool_ptr<const_soul::heart::FunctionCall> *)&t_2);
    if (!bVar1) {
      cast<soul::heart::ReadStream_const,soul::heart::Object_const>((soul *)&t_3,(Object *)t.object)
      ;
      bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&t_3);
      if (bVar1) {
        r = pool_ptr<const_soul::heart::ReadStream>::operator*
                      ((pool_ptr<const_soul::heart::ReadStream> *)&t_3);
        printDescription(this,r);
      }
      pool_ptr<const_soul::heart::ReadStream>::~pool_ptr
                ((pool_ptr<const_soul::heart::ReadStream> *)&t_3);
      if (!bVar1) {
        cast<soul::heart::WriteStream_const,soul::heart::Object_const>
                  ((soul *)&t_4,(Object *)t.object);
        bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&t_4);
        if (bVar1) {
          w = pool_ptr<const_soul::heart::WriteStream>::operator*
                        ((pool_ptr<const_soul::heart::WriteStream> *)&t_4);
          printDescription(this,w);
        }
        pool_ptr<const_soul::heart::WriteStream>::~pool_ptr
                  ((pool_ptr<const_soul::heart::WriteStream> *)&t_4);
        if (!bVar1) {
          cast<soul::heart::AdvanceClock_const,soul::heart::Object_const>
                    ((soul *)&t_5,(Object *)t.object);
          bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&t_5);
          if (bVar1) {
            pAVar2 = pool_ptr<const_soul::heart::AdvanceClock>::operator*
                               ((pool_ptr<const_soul::heart::AdvanceClock> *)&t_5);
            printDescription(this,pAVar2);
          }
          pool_ptr<const_soul::heart::AdvanceClock>::~pool_ptr
                    ((pool_ptr<const_soul::heart::AdvanceClock> *)&t_5);
          if (!bVar1) {
            cast<soul::heart::Branch_const,soul::heart::Object_const>
                      ((soul *)&t_6,(Object *)t.object);
            bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&t_6);
            if (bVar1) {
              b = pool_ptr<const_soul::heart::Branch>::operator*
                            ((pool_ptr<const_soul::heart::Branch> *)&t_6);
              printDescription(this,b);
            }
            pool_ptr<const_soul::heart::Branch>::~pool_ptr
                      ((pool_ptr<const_soul::heart::Branch> *)&t_6);
            if (!bVar1) {
              cast<soul::heart::BranchIf_const,soul::heart::Object_const>
                        ((soul *)&t_7,(Object *)t.object);
              bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&t_7);
              if (bVar1) {
                b_00 = pool_ptr<const_soul::heart::BranchIf>::operator*
                                 ((pool_ptr<const_soul::heart::BranchIf> *)&t_7);
                printDescription(this,b_00);
              }
              pool_ptr<const_soul::heart::BranchIf>::~pool_ptr
                        ((pool_ptr<const_soul::heart::BranchIf> *)&t_7);
              if (!bVar1) {
                cast<soul::heart::ReturnVoid_const,soul::heart::Object_const>
                          ((soul *)&t_8,(Object *)t.object);
                bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&t_8);
                if (bVar1) {
                  pRVar3 = pool_ptr<const_soul::heart::ReturnVoid>::operator*
                                     ((pool_ptr<const_soul::heart::ReturnVoid> *)&t_8);
                  printDescription(this,pRVar3);
                }
                pool_ptr<const_soul::heart::ReturnVoid>::~pool_ptr
                          ((pool_ptr<const_soul::heart::ReturnVoid> *)&t_8);
                if (!bVar1) {
                  cast<soul::heart::ReturnValue_const,soul::heart::Object_const>
                            ((soul *)&local_70,(Object *)t.object);
                  bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_70);
                  if (bVar1) {
                    r_00 = pool_ptr<const_soul::heart::ReturnValue>::operator*(&local_70);
                    printDescription(this,r_00);
                  }
                  pool_ptr<const_soul::heart::ReturnValue>::~pool_ptr(&local_70);
                  if (!bVar1) {
                    throwInternalCompilerError("printStatementDescription",0x238);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void printStatementDescription (const heart::Object& s)
        {
            #define SOUL_GET_STATEMENT_DESC(Type)     if (auto t = cast<const heart::Type> (s)) return printDescription (*t);
            SOUL_HEART_STATEMENTS (SOUL_GET_STATEMENT_DESC)
            SOUL_HEART_TERMINATORS (SOUL_GET_STATEMENT_DESC)

            SOUL_ASSERT_FALSE;
        }